

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkTraverseSupers(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  Vec_Ptr_t *vInputs;
  ulong uVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *Entry;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint nCapMin;
  long lVar10;
  
  lVar10 = ((long)fAnd + 1) * (long)p->pNtk->vObjs->nSize;
  iVar7 = (int)lVar10;
  vInputs = Vec_PtrAlloc(iVar7);
  vInputs->nSize = iVar7;
  uVar9 = 0;
  memset(vInputs->pArray,0,lVar10 * 8);
  pAVar1 = p->pNtk;
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    nCapMin = pAVar1->vObjs->nSize + 500;
    Vec_IntGrow(&pAVar1->vTravIds,nCapMin);
    uVar3 = 0;
    if (0 < (int)nCapMin) {
      uVar3 = (ulong)nCapMin;
    }
    for (; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      (pAVar1->vTravIds).pArray[uVar9] = 0;
    }
    (pAVar1->vTravIds).nSize = nCapMin;
  }
  iVar7 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar7 + 1;
  if (0x3ffffffe < iVar7) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if (fAnd == 0) {
    for (iVar7 = 0; iVar7 < p->pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCo(p->pNtk,iVar7);
      pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7) {
        Abc_NtkTraverseSupersXor_rec(p,pAVar4,vInputs);
      }
    }
  }
  else {
    for (iVar7 = 0; iVar7 < p->pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkCo(p->pNtk,iVar7);
      pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7) {
        Abc_NtkTraverseSupersAnd_rec(p,pAVar4,vInputs);
      }
    }
  }
  p->nStartCols = p->vObj2Lit->nSize;
  iVar7 = 0;
  for (iVar8 = 0; iVar8 < vInputs->nSize; iVar8 = iVar8 + 1) {
    pvVar5 = Vec_PtrEntry(vInputs,iVar8);
    if (pvVar5 != (void *)0x0) {
      iVar2 = *(int *)((long)pvVar5 + 4) + -2;
      if (iVar7 <= iVar2) {
        iVar7 = iVar2;
      }
    }
  }
  if (p->vBuckets == (Vec_Ptr_t *)0x0) {
    pVVar6 = Vec_PtrAlloc(iVar7 + 1);
    p->vBuckets = pVVar6;
    for (iVar8 = 0; iVar8 <= iVar7; iVar8 = iVar8 + 1) {
      pVVar6 = p->vBuckets;
      Entry = Vec_PtrAlloc(10);
      Vec_PtrPush(pVVar6,Entry);
    }
    for (iVar7 = 0; iVar7 < vInputs->nSize; iVar7 = iVar7 + 1) {
      pvVar5 = Vec_PtrEntry(vInputs,iVar7);
      if (pvVar5 != (void *)0x0) {
        pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,*(int *)((long)pvVar5 + 4) + -2);
        Vec_PtrPush(pVVar6,pvVar5);
      }
    }
    Vec_PtrFree(vInputs);
    return;
  }
  __assert_fail("p->vBuckets == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                ,0x158,"void Abc_NtkTraverseSupers(Abc_ShaMan_t *, int)");
}

Assistant:

void Abc_NtkTraverseSupers( Abc_ShaMan_t * p, int fAnd )
{
    Vec_Ptr_t * vInputs;
    Vec_Int_t * vInput;
    Abc_Obj_t * pObj;
    int i, nOnesMax;

    // create mapping of nodes into their column vectors
    vInputs = Vec_PtrStart( Abc_NtkObjNumMax(p->pNtk) * (1 + fAnd) );
    Abc_NtkIncrementTravId( p->pNtk );
    if ( fAnd )
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersAnd_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    p->nStartCols = Vec_IntSize(p->vObj2Lit);

    // find the largest number of 1s
    nOnesMax = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            nOnesMax = Abc_MaxInt( nOnesMax, Vec_IntSize(vInput)-SHARE_NUM );

    // create buckets
    assert( p->vBuckets == NULL );
    p->vBuckets = Vec_PtrAlloc( nOnesMax + 1 );
    for ( i = 0; i <= nOnesMax; i++ )
        Vec_PtrPush( p->vBuckets, Vec_PtrAlloc(10) );

    // load vectors into buckets
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vInput)-SHARE_NUM), vInput );
    Vec_PtrFree( vInputs );
}